

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  undefined8 *puVar2;
  string *psVar3;
  Nonnull<const_char_*> pcVar4;
  ExtensionSet *this_01;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  
  pVar5 = Insert(this,number);
  pEVar1 = pVar5.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_00288613;
    pcVar4 = (Nonnull<const_char_*>)0x0;
LAB_002885c6:
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if (0xed < (byte)(pEVar1->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 9)
        {
          pcVar4 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar1->type * 4),9,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
        }
        if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_00288695;
        goto LAB_002885f6;
      }
      this_01 = (ExtensionSet *)&stack0xffffffffffffffd0;
      AddString_abi_cxx11_(this_01);
LAB_00288632:
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_01,9,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_STRING");
      goto LAB_00288581;
    }
    AddString_abi_cxx11_();
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_00288613:
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,0,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
      goto LAB_002885c6;
    }
    this_01 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (this_01 != (ExtensionSet *)0x9) goto LAB_00288632;
    pcVar4 = (Nonnull<const_char_*>)0x0;
LAB_00288581:
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      pEVar1->is_packed = false;
      this_00 = this->arena_;
      if (this_00 == (Arena *)0x0) {
        puVar2 = (undefined8 *)operator_new(0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
      }
      else {
        puVar2 = (undefined8 *)Arena::Allocate(this_00,0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = this_00;
      }
      *(undefined8 **)&(pEVar1->field_0).int32_t_value = puVar2;
LAB_002885f6:
      psVar3 = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)pEVar1->field_0);
      return psVar3;
    }
  }
  AddString_abi_cxx11_();
LAB_00288695:
  AddString_abi_cxx11_();
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = false;
    extension->ptr.repeated_string_value =
        Arena::Create<RepeatedPtrField<std::string>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->ptr.repeated_string_value->Add();
}